

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

void __thiscall
chrono::ChFile_ps::ClipRectangle
          (ChFile_ps *this,ChVector2<double> *mfrom,ChVector2<double> *mwh,Space space)

{
  ChStreamOutAscii *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChVector2<double> local_a0;
  ChVector2<double> local_90;
  ChVector2<double> local_80;
  ChVector2<double> local_70;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  ChVector2<double> local_30;
  
  dVar1 = mfrom->m_data[0];
  dVar2 = mfrom->m_data[1];
  dVar3 = dVar1 + mwh->m_data[0];
  dVar4 = dVar2 + mwh->m_data[1];
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"NP\n");
  local_40.m_data[0] = mfrom->m_data[0];
  local_40.m_data[1] = mfrom->m_data[1];
  TransPt(this,&local_40,space);
  MoveTo(this,&local_30);
  local_60.m_data[0] = dVar3;
  local_60.m_data[1] = dVar2;
  TransPt(this,&local_60,space);
  AddLinePoint(this,&local_50);
  local_80.m_data[0] = dVar3;
  local_80.m_data[1] = dVar4;
  TransPt(this,&local_80,space);
  AddLinePoint(this,&local_70);
  local_a0.m_data[0] = dVar1;
  local_a0.m_data[1] = dVar4;
  TransPt(this,&local_a0,space);
  AddLinePoint(this,&local_90);
  ChStreamOutAscii::operator<<(this_00,"CP\n");
  ChStreamOutAscii::operator<<(this_00,"CL\n");
  return;
}

Assistant:

void ChFile_ps::ClipRectangle(ChVector2<> mfrom, ChVector2<> mwh, Space space) {
    ChVector2<> mp1, mp2, mp3;
    mp1.x() = mfrom.x() + mwh.x();
    mp1.y() = mfrom.y();
    mp2.x() = mfrom.x() + mwh.x();
    mp2.y() = mfrom.y() + mwh.y();
    mp3.x() = mfrom.x();
    mp3.y() = mfrom.y() + mwh.y();
    StartLine();
    MoveTo(TransPt(mfrom, space));
    AddLinePoint(TransPt(mp1, space));
    AddLinePoint(TransPt(mp2, space));
    AddLinePoint(TransPt(mp3, space));
    CloseLine();
    Clip();
}